

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlSubstitutionItem::DebugXmlRhs
          (GdlSubstitutionItem *this,GrcManager *pcman,ofstream *strmOut,string *param_3)

{
  pointer ppGVar1;
  ostream *poVar2;
  long lVar3;
  string local_50;
  
  poVar2 = std::operator<<((ostream *)strmOut,"          <rhsSlot className=\"");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,this->m_psymOutput);
  std::operator<<(poVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->m_pexpSelector != (GdlSlotRefExpression *)0x0) {
    poVar2 = std::operator<<((ostream *)strmOut,"\" selectorIndex=\"");
    std::ostream::operator<<(poVar2,this->m_pexpSelector->m_srNumber);
  }
  if ((this->m_vpexpAssocs).
      super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_vpexpAssocs).
      super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<((ostream *)strmOut,"\" associations=\"");
    for (lVar3 = 0;
        ppGVar1 = (this->m_vpexpAssocs).
                  super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar3 < ((long)(this->m_vpexpAssocs).
                       super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1) * 0x20000000 +
                -0x100000000 >> 0x20; lVar3 = lVar3 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(strmOut,ppGVar1[lVar3]->m_srNumber);
      std::operator<<(poVar2," ");
    }
    std::ostream::operator<<(strmOut,ppGVar1[lVar3]->m_srNumber);
  }
  if ((this->super_GdlSetAttrItem).m_vpavs.
      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_GdlSetAttrItem).m_vpavs.
      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<((ostream *)strmOut,"\" assignmentGdl=\"");
    (*(this->super_GdlSetAttrItem).super_GdlRuleItem._vptr_GdlRuleItem[0x27])
              (this,pcman,0,0,strmOut,1);
  }
  poVar2 = std::operator<<((ostream *)strmOut,"\" slotIndex=\"");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_iritContextPos + 1);
  std::operator<<(poVar2,"\" />\n");
  return;
}

Assistant:

void GdlSubstitutionItem::DebugXmlRhs(GrcManager * pcman, std::ofstream & strmOut,
	std::string /*staPathToCur*/)
{
	strmOut << "          <rhsSlot className=\"" << m_psymOutput->FullAbbrev();
	
	if (m_pexpSelector)
		strmOut << "\" selectorIndex=\"" << m_pexpSelector->SlotNumber();

	if (m_vpexpAssocs.size() > 0)
	{
		strmOut << "\" associations=\"";
		int iexp;
		for (iexp = 0; iexp < signed(m_vpexpAssocs.size()) - 1; iexp++)
			strmOut << m_vpexpAssocs[iexp]->SlotNumber() << " ";
		strmOut << m_vpexpAssocs[iexp]->SlotNumber();
	}

	if (m_vpavs.size() > 0)
	{
		strmOut << "\" assignmentGdl=\"";
		AttrSetterPrettyPrint(pcman, NULL, 0, strmOut, true);	// NULL and 0 are bogus but not used
	}
	strmOut << "\" slotIndex=\"" << m_iritContextPos + 1 << "\" />\n";

}